

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_rconf.c
# Opt level: O2

int mk_rconf_read(mk_rconf *conf,char *path)

{
  char cVar1;
  char cVar2;
  mk_list *pmVar3;
  mk_list *pmVar4;
  int iVar5;
  int pos_end;
  int *piVar6;
  FILE *__stream;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char **str;
  mk_rconf_section *pmVar10;
  ushort **ppuVar11;
  undefined8 *puVar12;
  char *pcVar13;
  uint len;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  uint local_112c;
  int local_110c;
  char *key;
  char *val;
  size_t local_10f8;
  mk_rconf_section *local_10f0;
  char *local_10e8;
  mk_list *local_10e0;
  char *local_10d8;
  mk_list *local_10d0;
  stat st;
  char tmp [4096];
  
  pcVar7 = path;
  if (((-1 < conf->level) && (iVar5 = stat(path,(stat *)&st), iVar5 == -1)) &&
     (piVar6 = __errno_location(), *piVar6 == 2)) {
    if (*path == '/') {
      return -1;
    }
    if (conf->root_path != (char *)0x0) {
      pcVar7 = tmp;
      snprintf(pcVar7,0x1000,"%s/%s",conf->root_path,path);
    }
  }
  pmVar3 = &conf->includes;
  while (pmVar3 = pmVar3->next, pmVar3 != &conf->includes) {
    iVar5 = strcmp((char *)pmVar3[-1].next,pcVar7);
    if (iVar5 == 0) {
      pcVar14 = "[config] file already included %s";
      iVar5 = 0x1001;
LAB_00110c50:
      mk_print(iVar5,pcVar14,pcVar7);
      return -1;
    }
  }
  conf->level = conf->level + 1;
  __stream = fopen(pcVar7,"r");
  if (__stream == (FILE *)0x0) {
    pcVar14 = "[config] I cannot open %s file";
    iVar5 = 0x1002;
    goto LAB_00110c50;
  }
  pcVar7 = (char *)mk_mem_alloc(0x1000);
  if (pcVar7 == (char *)0x0) {
    fclose(__stream);
    perror("malloc");
    return -1;
  }
  local_10e0 = &conf->sections;
  local_10d0 = &conf->metas;
  local_10d8 = pcVar7 + 9;
  local_10f8 = 0xffffffffffffffff;
  local_112c = 0;
  local_110c = 0;
  pcVar14 = (char *)0x0;
  local_10f0 = (mk_rconf_section *)0x0;
LAB_0011081b:
  do {
    do {
      pcVar8 = fgets(pcVar7,0x1000,__stream);
      if (pcVar8 == (char *)0x0) {
        fclose(__stream);
        free(pcVar14);
        free(pcVar7);
        puVar12 = (undefined8 *)mk_mem_alloc(0x18);
        if (puVar12 == (undefined8 *)0x0) {
          conf->level = conf->level + -1;
          return -1;
        }
        pcVar7 = mk_string_dup(path);
        *puVar12 = pcVar7;
        pmVar3 = (conf->includes).prev;
        (conf->includes).prev = (mk_list *)(puVar12 + 1);
        puVar12[2] = &conf->includes;
        puVar12[1] = pmVar3;
        pmVar3->next = (mk_list *)(puVar12 + 1);
        conf->level = conf->level + -1;
        return 0;
      }
      sVar9 = strlen(pcVar7);
      uVar15 = (uint)sVar9;
      if (((int)uVar15 < 1) || (pcVar7[uVar15 - 1] != '\n')) {
        iVar5 = feof(__stream);
        len = uVar15;
        if (iVar5 != 0) goto LAB_00110894;
        pcVar14 = "Length of content has exceeded limit";
LAB_00110cc4:
        mk_config_error(path,local_112c,pcVar14);
        fclose(__stream);
        goto LAB_00110d3d;
      }
      len = uVar15 - 1;
      pcVar7[len] = '\0';
      if (len == 0) {
        len = 0;
      }
      else if (pcVar7[uVar15 - 2] == '\r') {
        pcVar7[uVar15 - 2] = '\0';
        len = uVar15 - 2;
      }
LAB_00110894:
      local_112c = local_112c + 1;
      cVar1 = *pcVar7;
    } while ((cVar1 == '\0') || (cVar1 == '#'));
    if (((int)len < 10) ||
       (iVar5 = strncasecmp(pcVar7,"@INCLUDE ",9), pcVar8 = local_10d8, iVar5 != 0)) {
      if (3 < (int)len && cVar1 == '@') {
        str = (char **)mk_mem_alloc(0x20);
        if (str == (char **)0x0) goto LAB_00110d2a;
        pcVar8 = strchr(pcVar7,0x20);
        iVar5 = (int)pcVar8 - (int)pcVar7;
        pcVar8 = mk_string_copy_substr(pcVar7,1,iVar5);
        *str = pcVar8;
        mk_string_trim(str);
        pcVar8 = mk_string_copy_substr(pcVar7,iVar5 + 1,len);
        str[1] = pcVar8;
        mk_string_trim(str + 1);
        pmVar3 = local_10d0->prev;
        local_10d0->prev = (mk_list *)(str + 2);
        str[3] = (char *)local_10d0;
        str[2] = (char *)pmVar3;
        pmVar3->next = (mk_list *)(str + 2);
        goto LAB_0011081b;
      }
      if (cVar1 != '[') {
        if (pcVar14 == (char *)0x0) {
          uVar15 = 1;
          if (1 < (int)len) {
            uVar15 = len;
          }
          lVar16 = 1;
          do {
            if ((int)len <= lVar16) goto LAB_00110a42;
            ppuVar11 = __ctype_b_loc();
            pcVar14 = pcVar7 + lVar16;
            lVar16 = lVar16 + 1;
          } while (((*ppuVar11)[*pcVar14] & 1) != 0);
          uVar15 = (int)lVar16 - 1;
LAB_00110a42:
          pcVar14 = mk_string_copy_substr(pcVar7,0,uVar15);
          local_10f8 = strlen(pcVar14);
          if (uVar15 == len) goto LAB_0011081b;
        }
        lVar16 = 0;
        while( true ) {
          cVar1 = pcVar7[lVar16];
          cVar2 = pcVar14[lVar16];
          if ((cVar1 != cVar2) || (cVar2 == '\0')) break;
          lVar16 = lVar16 + 1;
        }
        ppuVar11 = __ctype_b_loc();
        if (cVar2 == '\0') {
          if (((*ppuVar11)[cVar1] & 1) == 0) {
            iVar5 = len - (int)local_10f8;
            if ((iVar5 != 0 && pcVar7[(int)local_10f8] != '#') &&
               ((((pcVar8 = pcVar7 + (int)local_10f8, iVar5 < 3 || (pcVar7[(int)local_10f8] != '-'))
                 || (pcVar8[1] != '-')) || (pcVar8[2] != '-')))) {
              pos_end = mk_string_char_search(pcVar8,0x20,iVar5);
              key = mk_string_copy_substr(pcVar8,0,pos_end);
              val = mk_string_copy_substr(pcVar8 + pos_end,1,iVar5 - pos_end);
              if (((pos_end < 0) || (key == (char *)0x0)) || (val == (char *)0x0)) {
                mk_config_error(path,local_112c,"Each key must have a value");
              }
              else {
                mk_string_trim(&key);
                mk_string_trim(&val);
                pcVar8 = val;
                if (*val != '\0') {
                  if ((conf->sections).next == local_10e0) {
                    mk_print(0x1001,"Error: there are not sections available on %s!",conf->file);
                  }
                  else {
                    local_10e8 = key;
                    pmVar3 = local_10e0->prev;
                    puVar12 = (undefined8 *)mk_mem_alloc(0x20);
                    pcVar13 = mk_string_dup(local_10e8);
                    *puVar12 = pcVar13;
                    pcVar8 = mk_string_dup(pcVar8);
                    puVar12[1] = pcVar8;
                    pmVar4 = pmVar3[-1].prev;
                    pmVar3[-1].prev = (mk_list *)(puVar12 + 2);
                    puVar12[3] = pmVar3 + -1;
                    puVar12[2] = pmVar4;
                    pmVar4->next = (mk_list *)(puVar12 + 2);
                  }
                  free(key);
                  free(val);
                  local_110c = local_110c + 1;
                  goto LAB_0011081b;
                }
                mk_config_error(path,local_112c,"Key has an empty value");
              }
              fclose(__stream);
              free(key);
              pcVar7 = val;
              goto LAB_00110d3d;
            }
            goto LAB_0011081b;
          }
          pcVar7 = "[config] Extra indentation level found";
        }
        else {
          pcVar7 = "[config] Inconsistent use of tab and space";
          if (((*ppuVar11)[cVar1] & 1) == 0) {
            pcVar7 = "[config] Indentation level is too low";
          }
        }
        mk_print(0x1001,pcVar7);
        mk_config_error(path,local_112c,"Invalid indentation level");
        fclose(__stream);
        return -1;
      }
      iVar5 = mk_string_char_search(pcVar7,0x5d,len);
      if (iVar5 < 1) {
        pcVar14 = "Bad header definition";
        goto LAB_00110cc4;
      }
      if (local_110c == 0 && local_10f0 != (mk_rconf_section *)0x0) {
        mk_print(0x1002,"Config file warning \'%s\':\n\t\t\t\tat line %i: %s",path,(ulong)local_112c
                 ,"Previous section did not have keys");
      }
      pcVar8 = mk_string_copy_substr(pcVar7,1,iVar5);
      pmVar10 = mk_rconf_section_add(conf,pcVar8);
      if (pmVar10 == (mk_rconf_section *)0x0) {
        fclose(__stream);
        free(pcVar14);
        free(pcVar7);
        pcVar7 = pcVar8;
        goto LAB_00110d3d;
      }
      local_10f0 = pmVar10;
      free(pcVar8);
      local_110c = 0;
      goto LAB_0011081b;
    }
    pcVar13 = strchr(local_10d8,0x2a);
    if (pcVar13 == (char *)0x0) {
      iVar5 = mk_rconf_read(conf,pcVar8);
    }
    else {
      iVar5 = mk_rconf_read_glob(conf,pcVar8);
    }
    if (iVar5 == -1) {
      conf->level = conf->level + -1;
LAB_00110d2a:
      fclose(__stream);
      free(pcVar14);
LAB_00110d3d:
      free(pcVar7);
      return -1;
    }
  } while( true );
}

Assistant:

static int mk_rconf_read(struct mk_rconf *conf, const char *path)
{
    int i;
    int len;
    int ret;
    int line = 0;
    int indent_len = -1;
    int n_keys = 0;
    char *buf;
    char tmp[PATH_MAX];
    char *section = NULL;
    char *indent = NULL;
    char *key, *val;
    char *cfg_file = (char *) path;
    struct stat st;
    struct mk_rconf_file *file;
    struct mk_rconf_section *current = NULL;
    FILE *f;

    /* Check if the path exists (relative cases for included files) */
    if (conf->level >= 0) {
        ret = stat(path, &st);
        if (ret == -1 && errno == ENOENT) {
            /* Try to resolve the real path (if exists) */
            if (path[0] == '/') {
                return -1;
            }

            if (conf->root_path) {
                snprintf(tmp, PATH_MAX, "%s/%s", conf->root_path, path);
                cfg_file = tmp;
            }
        }
    }

    /* Check this file have not been included before */
    ret = is_file_included(conf, cfg_file);
    if (ret == MK_TRUE) {
        mk_err("[config] file already included %s", cfg_file);
        return -1;
    }

    conf->level++;

    /* Open configuration file */
    if ((f = fopen(cfg_file, "r")) == NULL) {
        mk_warn("[config] I cannot open %s file", cfg_file);
        return -1;
    }

    /* Allocate temporal buffer to read file content */
    buf = mk_mem_alloc(MK_RCONF_KV_SIZE);
    if (!buf) {
        fclose(f);
        perror("malloc");
        return -1;
    }

    /* looking for configuration directives */
    while (fgets(buf, MK_RCONF_KV_SIZE, f)) {
        len = strlen(buf);
        if (len > 0 && buf[len - 1] == '\n') {
            buf[--len] = 0;
            if (len && buf[len - 1] == '\r') {
                buf[--len] = 0;
            }
        }
        else {
            /*
             * If we don't find a break line, validate if we got an EOF or not. No EOF
             * means that the incoming string is not finished so we must raise an
             * exception.
             */
            if (!feof(f)) {
                mk_config_error(path, line, "Length of content has exceeded limit");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* Line number */
        line++;

        if (!buf[0]) {
            continue;
        }

        /* Skip commented lines */
        if (buf[0] == '#') {
            continue;
        }

        if (len > 9 && strncasecmp(buf, "@INCLUDE ", 9) == 0) {
            if (strchr(buf + 9, '*') != NULL) {
                ret = mk_rconf_read_glob(conf, buf + 9);
            }
            else {
                ret = mk_rconf_read(conf, buf + 9);
            }
            if (ret == -1) {
                conf->level--;
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }
        else if (buf[0] == '@' && len > 3) {
            ret = mk_rconf_meta_add(conf, buf, len);
            if (ret == -1) {
                fclose(f);
                if (indent) {
                    mk_mem_free(indent);
                }
                mk_mem_free(buf);
                return -1;
            }
            continue;
        }

        /* Section definition */
        if (buf[0] == '[') {
            int end = -1;
            end = mk_string_char_search(buf, ']', len);
            if (end > 0) {
                /*
                 * Before to add a new section, lets check the previous
                 * one have at least one key set
                 */
                if (current && n_keys == 0) {
                    mk_rconf_warning(path, line, "Previous section did not have keys");
                }

                /* Create new section */
                section = mk_string_copy_substr(buf, 1, end);
                current = mk_rconf_section_add(conf, section);
                if (!current) {
                    fclose(f);
                    if (indent) {
                        mk_mem_free(indent);
                    }
                    mk_mem_free(buf);
                    mk_mem_free(section);
                    return -1;
                }
                mk_mem_free(section);
                n_keys = 0;
                continue;
            }
            else {
                mk_config_error(path, line, "Bad header definition");
                fclose(f);
                mk_mem_free(buf);
                return -1;
            }
        }

        /* No separator defined */
        if (!indent) {
            i = 0;

            do { i++; } while (i < len && isblank(buf[i]));

            indent = mk_string_copy_substr(buf, 0, i);
            indent_len = strlen(indent);

            /* Blank indented line */
            if (i == len) {
                continue;
            }
        }

        /* Validate indentation level */
        if (check_indent(buf, indent) < 0) {
            mk_config_error(path, line, "Invalid indentation level");
            fclose(f);
            return -1;
        }

        if (buf[indent_len] == '#' || indent_len == len) {
            continue;
        }

        if (len - indent_len >= 3 && strncmp(buf + indent_len, "---", 3) == 0) {
            continue;
        }

        /* Get key and val */
        i = mk_string_char_search(buf + indent_len, ' ', len - indent_len);
        key = mk_string_copy_substr(buf + indent_len, 0, i);
        val = mk_string_copy_substr(buf + indent_len + i, 1, len - indent_len - i);

        if (!key || !val || i < 0) {
            mk_config_error(path, line, "Each key must have a value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Trim strings */
        mk_string_trim(&key);
        mk_string_trim(&val);

        if (strlen(val) == 0) {
            mk_config_error(path, line, "Key has an empty value");
            fclose(f);
            mk_mem_free(key);
            mk_mem_free(val);
            return -1;
        }

        /* Register entry: key and val are copied as duplicated */
        mk_rconf_section_entry_add(conf, key, val);

        /* Free temporal key and val */
        mk_mem_free(key);
        mk_mem_free(val);

        n_keys++;
    }

    if (section && n_keys == 0) {
        /* No key, no warning */
    }

    /*
    struct mk_config_section *s;
    struct mk_rconf_entry *e;

    s = conf->section;
    while(s) {
        printf("\n[%s]", s->name);
        e = s->entry;
        while(e) {
            printf("\n   %s = %s", e->key, e->val);
            e = e->next;
        }
        s = s->next;
    }
    fflush(stdout);
    */
    fclose(f);
    if (indent) {
        mk_mem_free(indent);
    }
    mk_mem_free(buf);

    /* Append this file to the list */
    file = mk_mem_alloc(sizeof(struct mk_rconf_file));
    if (!file) {
        conf->level--;
        return -1;
    }

    file->path = mk_string_dup(path);
    mk_list_add(&file->_head, &conf->includes);
    conf->level--;
    return 0;
}